

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall
CoreTest_FormatForeignStrings_Test::TestBody(CoreTest_FormatForeignStrings_Test *this)

{
  int *in_RCX;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  AssertionResult gtest_ar_2;
  undefined4 local_18;
  
  my_ns::my_string<char>::my_string((my_string<char> *)&gtest_ar_2,"{}");
  local_18 = 0x2a;
  fmt::v5::format<my_ns::my_string<char>,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
             (v5 *)&gtest_ar_2,(my_string<char> *)&stack0xffffffffffffffe8,in_RCX);
  pbVar1 = &local_58;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"fmt::format(my_string<char>(\"{}\"), 42)","\"42\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar1,
             (char (*) [3])"42");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x238;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  my_ns::my_string<wchar_t>::my_string((my_string<wchar_t> *)&gtest_ar_2,L"{}");
  local_18 = 0x2a;
  fmt::v5::format<my_ns::my_string<wchar_t>,int>
            (&local_58,(v5 *)&gtest_ar_2,(my_string<wchar_t> *)&stack0xffffffffffffffe8,
             (int *)pbVar1);
  pbVar1 = &local_58;
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&gtest_ar,"fmt::format(my_string<wchar_t>(L\"{}\"), 42)","L\"42\"",pbVar1,
             (wchar_t (*) [3])L"42");
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x239;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x239,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  FakeQt::QString::QString((QString *)&gtest_ar,L"{}");
  local_18 = 0x2a;
  fmt::v5::format<FakeQt::QString,int>
            (&local_58,(v5 *)&gtest_ar,(QString *)&stack0xffffffffffffffe8,(int *)pbVar1);
  pbVar1 = &local_58;
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&gtest_ar_2,"fmt::format(QString(L\"{}\"), 42)","L\"42\"",pbVar1,
             (wchar_t (*) [3])L"42");
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x23a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  FakeQt::QString::QString((QString *)&stack0xffffffffffffffe8,L"{}");
  my_ns::my_string<wchar_t>::my_string((my_string<wchar_t> *)&gtest_ar_2,L"42");
  fmt::v5::format<FakeQt::QString,my_ns::my_string<wchar_t>>
            (&local_58,(v5 *)&stack0xffffffffffffffe8,(QString *)&gtest_ar_2,
             (my_string<wchar_t> *)pbVar1);
  pbVar1 = &local_58;
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&gtest_ar,"fmt::format(QString(L\"{}\"), my_string<wchar_t>(L\"42\"))",
             "L\"42\"",pbVar1,(wchar_t (*) [3])L"42");
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pbVar1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x23b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  my_ns::my_string<wchar_t>::my_string((my_string<wchar_t> *)&gtest_ar_2,L"{}");
  FakeQt::QString::QString((QString *)&stack0xffffffffffffffe8,L"42");
  fmt::v5::format<my_ns::my_string<wchar_t>,FakeQt::QString>
            (&local_58,(v5 *)&gtest_ar_2,(my_string<wchar_t> *)&stack0xffffffffffffffe8,
             (QString *)pbVar1);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&gtest_ar,"fmt::format(my_string<wchar_t>(L\"{}\"), QString(L\"42\"))",
             "L\"42\"",&local_58,(wchar_t (*) [3])L"42");
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(CoreTest, FormatForeignStrings) {
  using namespace my_ns;
  using namespace FakeQt;
  EXPECT_EQ(fmt::format(my_string<char>("{}"), 42), "42");
  EXPECT_EQ(fmt::format(my_string<wchar_t>(L"{}"), 42), L"42");
  EXPECT_EQ(fmt::format(QString(L"{}"), 42), L"42");
  EXPECT_EQ(fmt::format(QString(L"{}"), my_string<wchar_t>(L"42")), L"42");
  EXPECT_EQ(fmt::format(my_string<wchar_t>(L"{}"), QString(L"42")), L"42");
}